

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_status
aspa_table_update_swap_in_compute
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update **update)

{
  ulong uVar1;
  aspa_update_operation *paVar2;
  aspa_update_operation *paVar3;
  aspa_array *array;
  size_t __nmemb;
  uint32_t *__base;
  aspa_array *array_00;
  aspa_update *paVar4;
  aspa_store_node **ppaVar5;
  aspa_store_node *paVar6;
  ulong uVar7;
  aspa_record *paVar8;
  aspa_record *paVar9;
  aspa_update_operation *paVar10;
  aspa_status aVar11;
  ulong index;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  aspa_array *new_array;
  aspa_store_node **node;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a5,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a6,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (update == (aspa_update **)0x0) {
    __assert_fail("update",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a7,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    aVar11 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010d13f;
  }
  if (*update == (aspa_update *)0x0) {
    paVar4 = (aspa_update *)lrtr_malloc(0x30);
    *update = paVar4;
    if (paVar4 != (aspa_update *)0x0) goto LAB_0010cdcc;
  }
  else {
LAB_0010cdcc:
    pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
    (*update)->table = aspa_table;
    (*update)->operations = operations;
    paVar4 = *update;
    paVar4->operation_count = count;
    paVar4->failed_operation = (aspa_update_operation *)0x0;
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    ppaVar5 = aspa_store_get_node(&aspa_table->store,rtr_socket);
    node = ppaVar5;
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    if ((ppaVar5 == (aspa_store_node **)0x0) ||
       (paVar6 = *ppaVar5, paVar6 == (aspa_store_node *)0x0)) {
      new_array = (aspa_array *)0x0;
      aVar11 = aspa_array_create(&new_array);
      if (aVar11 == ASPA_SUCCESS) {
        pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
        aVar11 = aspa_store_create_node(&aspa_table->store,rtr_socket,new_array,&node);
        if ((node != (aspa_store_node **)0x0 && aVar11 == ASPA_SUCCESS) &&
           (*node != (aspa_store_node *)0x0)) {
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          if (node == (aspa_store_node **)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x1db,
                          "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                         );
          }
          paVar6 = *node;
          if (paVar6 == (aspa_store_node *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                          ,0x1dc,
                          "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                         );
          }
          goto LAB_0010ce45;
        }
        aspa_array_free(new_array,false);
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      }
    }
    else {
LAB_0010ce45:
      if (paVar6->aspa_array == (aspa_array *)0x0) {
        __assert_fail("(*node)->aspa_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x1dd,
                      "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                     );
      }
      new_array = (aspa_array *)0x0;
      aVar11 = aspa_array_create(&new_array);
      if (aVar11 == ASPA_SUCCESS) {
        pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
        array_00 = new_array;
        array = (*node)->aspa_array;
        if (array == (aspa_array *)0x0) {
          __assert_fail("array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11c,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        if (operations == (aspa_update_operation *)0x0) {
          __assert_fail("operations",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11d,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        paVar4 = *update;
        aspa_array_reserve(new_array,array->size + count);
        index = 0;
        uVar1 = 0;
LAB_0010cec1:
        uVar7 = uVar1;
        if (uVar7 < count) {
          paVar3 = operations + uVar7 + 1;
          paVar10 = (aspa_update_operation *)0x0;
          if (uVar7 < count - 1) {
            paVar10 = paVar3;
          }
          paVar2 = operations + uVar7;
          __nmemb = paVar3[-1].record.provider_count;
          if (paVar3[-1].type == ASPA_REMOVE) {
            if (__nmemb != 0) {
              __assert_fail("current->record.provider_count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12d,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
            if ((paVar2->record).provider_asns != (uint32_t *)0x0) {
              __assert_fail("!current->record.provider_asns",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12e,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
          }
          else if ((__nmemb != 0) &&
                  (__base = (paVar2->record).provider_asns, __base != (uint32_t *)0x0)) {
            qsort(__base,__nmemb,4,compare_asns);
          }
          uVar1 = uVar7 + 1;
          paVar9 = &paVar2->record;
          while ((index < array->size &&
                 (paVar8 = aspa_array_get_record(array,index),
                 paVar8->customer_asn < paVar9->customer_asn))) {
            index = index + 1;
            aVar11 = aspa_array_append(array_00,paVar8,false);
            if (aVar11 != ASPA_SUCCESS) goto LAB_0010d165;
          }
          paVar8 = aspa_array_get_record(array,index);
          if (paVar8 == (aspa_record *)0x0) {
            bVar12 = false;
          }
          else {
            bVar12 = paVar8->customer_asn == paVar9->customer_asn;
          }
          if (uVar7 < count - 1) {
            bVar13 = (paVar3->record).customer_asn == paVar9->customer_asn;
          }
          else {
            bVar13 = false;
          }
          if (paVar2->type == ASPA_REMOVE) {
            if (!bVar12) {
              paVar4->failed_operation = paVar2;
LAB_0010d219:
              aVar11 = ASPA_RECORD_NOT_FOUND;
              goto LAB_0010d177;
            }
            if ((bVar13) && (paVar10->type == ASPA_REMOVE)) {
              paVar4->failed_operation = paVar10;
              goto LAB_0010d219;
            }
            index = index + 1;
            (paVar2->record).provider_count = paVar8->provider_count;
            (paVar2->record).provider_asns = paVar8->provider_asns;
          }
          else if (paVar2->type == ASPA_ADD) {
            if (bVar12) {
              paVar4->failed_operation = paVar2;
LAB_0010d209:
              aVar11 = ASPA_DUPLICATE_RECORD;
              goto LAB_0010d177;
            }
            if (bVar13) {
              if (paVar10->type == ASPA_REMOVE) {
                paVar2->is_no_op = true;
                paVar10->is_no_op = true;
                uVar1 = uVar7 + 2;
                goto LAB_0010cec1;
              }
              if (paVar10->type == ASPA_ADD) {
                paVar4->failed_operation = paVar10;
                (paVar2->record).provider_asns = (uint32_t *)0x0;
                goto LAB_0010d209;
              }
            }
            aVar11 = aspa_array_append(array_00,paVar9,true);
            if (aVar11 != ASPA_SUCCESS) {
LAB_0010d165:
              paVar4->failed_operation = paVar2;
              aVar11 = ASPA_ERROR;
              goto LAB_0010d177;
            }
            paVar9 = aspa_array_get_record(array_00,(ulong)(array_00->size - 1));
            (paVar2->record).provider_asns = paVar9->provider_asns;
          }
          goto LAB_0010cec1;
        }
        aVar11 = ASPA_SUCCESS;
        for (; index < array->size; index = index + 1) {
          paVar9 = aspa_array_get_record(array,index);
          aspa_array_append(array_00,paVar9,false);
        }
LAB_0010d177:
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        if (uVar7 < count) {
          (*update)->node = (aspa_store_node *)0x0;
          (*update)->new_array = (aspa_array *)0x0;
          aspa_array_free(new_array,false);
        }
        else {
          (*update)->node = *node;
          (*update)->new_array = new_array;
          aVar11 = ASPA_SUCCESS;
        }
        goto LAB_0010d13f;
      }
    }
  }
  aVar11 = ASPA_ERROR;
LAB_0010d13f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return aVar11;
}

Assistant:

enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						   struct aspa_update_operation *operations, size_t count,
						   struct aspa_update **update)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(update);

	if (!aspa_table || !rtr_socket || !update || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	if (!*update) {
		*update = lrtr_malloc(sizeof(struct aspa_update));

		if (!*update)
			return ASPA_ERROR;
	}

	// MARK: Update Lock
	// Prevent interim writes to the table: We need to make sure the table stays the same
	// until the cleanup since the computed update is based on the state the table is in right now
	pthread_rwlock_wrlock(&aspa_table->update_lock);

	(*update)->table = aspa_table;
	(*update)->operations = operations;
	(*update)->operation_count = count;
	(*update)->failed_operation = NULL;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_rdlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	pthread_rwlock_unlock(&aspa_table->lock);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		pthread_rwlock_wrlock(&aspa_table->lock);
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
		pthread_rwlock_unlock(&aspa_table->lock);
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	// Create new array that will hold updated record data
	struct aspa_array *new_array = NULL;

	if (aspa_array_create(&new_array) != ASPA_SUCCESS)
		return ASPA_ERROR;

	// Populate new_array
	pthread_rwlock_rdlock(&aspa_table->lock);
	enum aspa_status res = aspa_table_update_compute_internal(rtr_socket, (*node)->aspa_array, new_array,
								  operations, count, &(*update)->failed_operation);
	pthread_rwlock_unlock(&aspa_table->lock);

	if (res == ASPA_SUCCESS) {
		(*update)->node = *node;
		(*update)->new_array = new_array;
	} else {
		(*update)->node = NULL;
		(*update)->new_array = NULL;

		// Update computation failed so release newly created array.
		// We must not release associated provider arrays here.
		aspa_array_free(new_array, false);
	}
	return res;
}